

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

baseHolder * __thiscall
cs_impl::any::holder<cs::tree_type<cs::token_base_*>_>::duplicate
          (holder<cs::tree_type<cs::token_base_*>_> *this)

{
  holder<cs::tree_type<cs::token_base_*>_> *phVar1;
  
  phVar1 = cs::
           allocator_type<cs_impl::any::holder<cs::tree_type<cs::token_base*>>,64ul,cs_impl::default_allocator_provider>
           ::alloc<cs::tree_type<cs::token_base*>&>
                     ((allocator_type<cs_impl::any::holder<cs::tree_type<cs::token_base*>>,64ul,cs_impl::default_allocator_provider>
                       *)holder<cs::tree_type<cs::token_base*>>::allocator,&this->mDat);
  return &phVar1->super_baseHolder;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}